

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O0

FiniteAutomaton *
Omega_h::FiniteAutomaton::concat
          (FiniteAutomaton *__return_storage_ptr__,FiniteAutomaton *a,FiniteAutomaton *b,int token)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 local_4c;
  undefined4 local_48;
  int i_1;
  int i;
  int epsilon0;
  int b_offset;
  int nsymbols;
  int token_local;
  FiniteAutomaton *b_local;
  FiniteAutomaton *a_local;
  FiniteAutomaton *out;
  
  iVar1 = get_nsymbols(a);
  iVar2 = get_nstates(a);
  iVar3 = get_nstates(b);
  FiniteAutomaton(__return_storage_ptr__,iVar1,false,iVar2 + iVar3);
  append_states(__return_storage_ptr__,a);
  iVar1 = get_nstates(__return_storage_ptr__);
  append_states(__return_storage_ptr__,b);
  iVar2 = get_epsilon0(__return_storage_ptr__);
  for (local_48 = 0; iVar3 = get_nstates(a), local_48 < iVar3; local_48 = local_48 + 1) {
    iVar3 = accepts(a,local_48);
    if (iVar3 != -1) {
      add_transition(__return_storage_ptr__,local_48,iVar2,iVar1);
      remove_accept(__return_storage_ptr__,local_48);
    }
  }
  for (local_4c = 0; iVar2 = get_nstates(b), local_4c < iVar2; local_4c = local_4c + 1) {
    iVar2 = accepts(b,local_4c);
    if (iVar2 != -1) {
      add_accept(__return_storage_ptr__,local_4c + iVar1,token);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FiniteAutomaton FiniteAutomaton::concat(
    FiniteAutomaton const& a, FiniteAutomaton const& b, int token) {
  auto nsymbols = get_nsymbols(a);
  FiniteAutomaton out(nsymbols, false, get_nstates(a) + get_nstates(b));
  append_states(out, a);
  auto b_offset = get_nstates(out);
  append_states(out, b);
  auto epsilon0 = get_epsilon0(out);
  for (int i = 0; i < get_nstates(a); ++i) {
    if (accepts(a, i) != -1) {
      add_transition(out, i, epsilon0, b_offset);
      remove_accept(out, i);
    }
  }
  for (int i = 0; i < get_nstates(b); ++i) {
    if (accepts(b, i) != -1) {
      add_accept(out, i + b_offset, token);
    }
  }
  return out;
}